

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

int __thiscall
google::protobuf::Reflection::GetRepeatedEnumValue
          (Reflection *this,Message *message,FieldDescriptor *field,int index)

{
  byte bVar1;
  Descriptor *pDVar2;
  uint32_t uVar3;
  int iVar4;
  RepeatedField<int> *this_00;
  const_reference piVar5;
  char *description;
  Metadata MVar6;
  
  MVar6 = Message::GetMetadata(message);
  if (MVar6.reflection != this) {
LAB_00f6319c:
    pDVar2 = this->descriptor_;
    MVar6 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar2,MVar6.descriptor,field,"GetRepeatedEnumValue");
  }
  pDVar2 = this->descriptor_;
  if (field->containing_type_ == pDVar2) {
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
      GetRepeatedEnumValue();
      goto LAB_00f6319c;
    }
    if ((bVar1 & 0x20) != 0) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 8) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (pDVar2,field,"GetRepeatedEnumValue",CPPTYPE_ENUM);
      }
      if ((bVar1 & 8) == 0) {
        this_00 = GetRaw<google::protobuf::RepeatedField<int>>(this,message,field);
        piVar5 = RepeatedField<int>::Get(this_00,index);
        return *piVar5;
      }
      uVar3 = protobuf::internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
      iVar4 = protobuf::internal::ExtensionSet::GetRepeatedEnum
                        ((ExtensionSet *)
                         ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                         field->number_,index);
      return iVar4;
    }
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar2,field,"GetRepeatedEnumValue",description);
}

Assistant:

int Reflection::GetRepeatedEnumValue(const Message& message,
                                     const FieldDescriptor* field,
                                     int index) const {
  USAGE_CHECK_ALL(GetRepeatedEnumValue, REPEATED, ENUM);

  int value;
  if (field->is_extension()) {
    value = GetExtensionSet(message).GetRepeatedEnum(field->number(), index);
  } else {
    value = GetRepeatedField<int>(message, field, index);
  }
  return value;
}